

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getIntegerType(TokenKind kind)

{
  SyntaxKind SVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 0x6d) {
    SVar1 = BitType;
  }
  else {
    if (iVar2 != 0x72) {
      if (iVar2 == 0xc5) {
        return IntType;
      }
      if (iVar2 == 0xc6) {
        return IntegerType;
      }
      if (iVar2 == 300) {
        return TimeType;
      }
      if (iVar2 != 0xd4) {
        if (iVar2 == 0x101) {
          return RegType;
        }
        if (iVar2 != 0x113) {
          if (iVar2 == 0xd3) {
            return LogicType;
          }
          return Unknown;
        }
        return ShortIntType;
      }
      return LongIntType;
    }
    SVar1 = ByteType;
  }
  return SVar1;
}

Assistant:

SyntaxKind SyntaxFacts::getIntegerType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword: return SyntaxKind::BitType;
        case TokenKind::LogicKeyword: return SyntaxKind::LogicType;
        case TokenKind::RegKeyword: return SyntaxKind::RegType;
        case TokenKind::ByteKeyword: return SyntaxKind::ByteType;
        case TokenKind::ShortIntKeyword: return SyntaxKind::ShortIntType;
        case TokenKind::IntKeyword: return SyntaxKind::IntType;
        case TokenKind::LongIntKeyword: return SyntaxKind::LongIntType;
        case TokenKind::IntegerKeyword: return SyntaxKind::IntegerType;
        case TokenKind::TimeKeyword: return SyntaxKind::TimeType;
        default: return SyntaxKind::Unknown;
    }
}